

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableElimination.cpp
# Opt level: O3

ClauseIterator __thiscall
Inferences::ALASCA::VariableElimination::applyRule<Kernel::NumTraits<Kernel::RationalConstantType>>
          (VariableElimination *this,Clause *premise,
          FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>_> *found)

{
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar1;
  VariableElimination *pVVar2;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar3;
  TermList TVar4;
  Term *pTVar5;
  Literal *pLVar6;
  TermList arg2;
  TermList sort;
  uint uVar7;
  uint uVar8;
  uint *in_RCX;
  long lVar9;
  FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  size_t sVar14;
  anon_class_8_1_54a39809_for__func aVar15;
  anon_class_8_1_54a39809_for__func aVar16;
  undefined8 *puVar17;
  undefined8 *puVar18;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *i;
  ulong uVar19;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *i_1;
  code *pcVar20;
  void **head;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *j_1;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar21;
  ulong uVar22;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar23;
  uint *puVar24;
  anon_class_16_1_54a39818_for_b b;
  Stack<Kernel::Literal_*> local_388;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_368;
  uint *local_360;
  undefined1 local_358 [20];
  uint local_344;
  FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_340;
  undefined1 local_338 [8];
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFStack_330;
  anon_class_8_1_54a39809_for__func local_328;
  anon_class_8_1_54a39809_for__func aStack_320;
  anon_class_8_1_54a39818_for__func local_318;
  Value local_310;
  anon_class_8_1_54a39809_for__func local_2e0;
  anon_class_8_1_54a39809_for__func local_2d8;
  anon_class_8_1_54a39809_for__func local_2d0;
  anon_class_8_1_54a39801_for__func local_2c8;
  anon_class_8_1_54a39801_for__func local_2c0;
  unsigned_long uStack_2b8;
  unsigned_long local_2b0;
  OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*> local_2a8;
  OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*> local_2a0;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *local_290;
  ulong local_288;
  VariableElimination *local_280;
  long local_278;
  undefined8 *puStack_270;
  undefined8 *local_268;
  undefined8 uStack_260;
  long local_250;
  undefined8 *local_248;
  undefined8 *puStack_240;
  undefined8 local_238;
  OptionBase<std::vector<bool,_std::allocator<bool>_>_> local_230;
  undefined1 local_200;
  IterTraits<Lib::MappingIterator<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:313:12),_Kernel::Clause_*>_>
  local_1f8;
  anon_class_184_10_db932ed9_for__func local_e8;
  
  lVar9 = DAT_00b521c0;
  uVar22 = *(long *)(in_RCX + 0x18) - *(long *)(in_RCX + 0x16) >> 6;
  local_344 = *in_RCX;
  local_290 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)(in_RCX + 2);
  if (*(long *)(in_RCX + 0x18) != *(long *)(in_RCX + 0x16)) {
    *(int *)(DAT_00b521c0 + 0x194) = *(int *)(DAT_00b521c0 + 0x194) + 1;
  }
  *(int *)(lVar9 + 0x198) = *(int *)(lVar9 + 0x198) + (int)uVar22;
  if (*(uint *)(lVar9 + 0x19c) < uVar22) {
    *(int *)(lVar9 + 0x19c) = (int)uVar22;
  }
  lVar9 = *(long *)(in_RCX + 8) - *(long *)(in_RCX + 6) >> 6;
  lVar13 = *(long *)(in_RCX + 0x10) - *(long *)(in_RCX + 0xe) >> 6;
  lVar12 = *(long *)(in_RCX + 0x20) - *(long *)(in_RCX + 0x1e) >> 6;
  sVar14 = ((lVar13 * lVar9 + (ulong)((uint)(found->negIneq)._stack & 0xfffff)) -
           (lVar12 + lVar13 + lVar9 + uVar22)) + (lVar13 + lVar9) * lVar12;
  local_388._capacity = sVar14;
  local_340 = found;
  local_280 = this;
  if (sVar14 == 0) {
    local_388._stack = (Literal **)0x0;
  }
  else {
    uVar19 = sVar14 * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar19 == 0) {
      local_388._stack =
           (Literal **)
           Lib::FixedSizeAllocator<8UL>::alloc
                     ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar19 < 0x11) {
      local_388._stack =
           (Literal **)
           Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar19 < 0x19) {
      local_388._stack =
           (Literal **)
           Lib::FixedSizeAllocator<24UL>::alloc
                     ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar19 < 0x21) {
      local_388._stack =
           (Literal **)
           Lib::FixedSizeAllocator<32UL>::alloc
                     ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar19 < 0x31) {
      local_388._stack =
           (Literal **)
           Lib::FixedSizeAllocator<48UL>::alloc
                     ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar19 < 0x41) {
      local_388._stack =
           (Literal **)
           Lib::FixedSizeAllocator<64UL>::alloc
                     ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      local_388._stack = (Literal **)::operator_new(uVar19,0x10);
    }
  }
  local_388._end = local_388._stack + sVar14;
  local_358._0_8_ = local_338;
  local_328.i = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  aStack_320.i = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_338 = (undefined1  [8])0x0;
  pFStack_330 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_388._cursor = local_388._stack;
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)local_358,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 0x14));
  pFVar10 = local_340;
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)local_358,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 0x1c));
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)local_358,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 4));
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)local_358,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 0xc));
  aVar16.i = local_328.i;
  pFVar3 = pFStack_330;
  aVar15.i = pFStack_330;
  local_360 = in_RCX;
  local_288 = uVar22;
  if (pFStack_330 != local_328.i) {
    uVar22 = (long)local_328.i - (long)pFStack_330 >> 2;
    lVar9 = 0x3f;
    if (uVar22 != 0) {
      for (; uVar22 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pFStack_330,local_328.i,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(pFVar3,aVar16.i);
    aVar15.i = local_328.i;
    if (pFStack_330 != local_328.i) {
      uVar7 = pFStack_330->idx;
      pFVar3 = (pFVar10->negIneq)._stack;
      pFVar21 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                &pFStack_330->field_0x4;
      uVar8 = (uint)pFVar3 & 0xfffff;
      goto LAB_00481417;
    }
  }
  pFVar3 = (pFVar10->negIneq)._stack;
  uVar7 = (uint)pFVar3 & 0xfffff;
  pFVar21 = pFStack_330;
  uVar8 = uVar7;
LAB_00481417:
  uVar22 = (ulong)uVar8;
  if (uVar8 != 0) {
    uVar19 = 0;
    do {
      if (uVar19 == uVar7) {
        if (pFVar21 == aVar15.i) {
          uVar7 = (uint)uVar22;
        }
        else {
          uVar7 = pFVar21->idx;
          pFVar21 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                    &pFVar21->field_0x4;
        }
      }
      else {
        pLVar6 = (Literal *)(&(pFVar10->neq)._capacity)[uVar19];
        if (local_388._cursor == local_388._end) {
          Lib::Stack<Kernel::Literal_*>::expand(&local_388);
          pFVar10 = local_340;
        }
        *local_388._cursor = pLVar6;
        local_388._cursor = local_388._cursor + 1;
        pFVar3 = (pFVar10->negIneq)._stack;
      }
      uVar19 = uVar19 + 1;
      uVar22 = (ulong)((uint)pFVar3 & 0xfffff);
    } while (uVar19 < uVar22);
  }
  puVar24 = local_360;
  if (pFStack_330 != (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
    uVar22 = (long)local_338 * 4 + 0xfU & 0xfffffffffffffff0;
    if (uVar22 == 0) {
      *(undefined8 *)pFStack_330 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pFStack_330;
    }
    else if (uVar22 < 0x11) {
      *(undefined8 *)pFStack_330 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pFStack_330;
    }
    else if (uVar22 < 0x19) {
      *(undefined8 *)pFStack_330 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pFStack_330;
    }
    else if (uVar22 < 0x21) {
      *(undefined8 *)pFStack_330 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pFStack_330;
    }
    else if (uVar22 < 0x31) {
      *(undefined8 *)pFStack_330 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pFStack_330;
    }
    else if (uVar22 < 0x41) {
      *(undefined8 *)pFStack_330 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pFStack_330;
    }
    else {
      operator_delete(pFStack_330,0x10);
    }
  }
  local_358._0_4_ = local_344;
  local_358._8_8_ = local_290;
  pFVar3 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(puVar24 + 6);
  local_368 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(puVar24 + 8)
  ;
  if (pFVar3 != local_368) {
    do {
      pFVar1 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                (puVar24 + 0x10);
      pFVar21 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                 (puVar24 + 0xe);
      pFVar23 = pFVar21;
      puVar24 = local_360;
      for (; local_360 = puVar24, pFVar21 != pFVar1; pFVar21 = pFVar21 + 1) {
        if (((pFVar3->literal)._symbol != GREATER) ||
           (pcVar20 = Kernel::NumTraits<Kernel::RationalConstantType>::greater,
           (pFVar21->literal)._symbol != GREATER)) {
          pcVar20 = Kernel::NumTraits<Kernel::RationalConstantType>::geq;
        }
        local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)(pFVar3->literal)._term._ptr;
        local_310._24_8_ =
             ((long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                    local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_cursor -
              (long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                    local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_stack >> 4) *
             -0x5555555555555555;
        local_2c8.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                      (pFVar21->literal)._term._ptr;
        local_2b0 = ((long)(local_2c8.a)->_cursor - (long)(local_2c8.a)->_stack >> 4) *
                    -0x5555555555555555;
        local_2c0.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)0x0;
        uStack_2b8 = 0;
        local_318.x = (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                       *)local_358;
        local_310._8_8_ = 0;
        local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_338._1_7_ = (undefined7)((ulong)local_338 >> 8);
        local_338[0] = 1;
        local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        local_2a8._elem = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
        local_328.i = pFVar3;
        aStack_320.i = pFVar3;
        local_2e0.i = pFVar23;
        local_2d8.i = pFVar23;
        local_2d0.i = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                      local_318.x;
        TVar4 = Kernel::NumTraits<Kernel::RationalConstantType>::sum<_f61951ce_>
                          ((IterTraits<_fd1694d2_> *)local_338);
        pTVar5 = Kernel::NumTraits<Kernel::RationalConstantType>::zeroT();
        pLVar6 = (Literal *)(*pcVar20)(1,TVar4._content,pTVar5);
        if (local_388._cursor == local_388._end) {
          Lib::Stack<Kernel::Literal_*>::expand(&local_388);
        }
        *local_388._cursor = pLVar6;
        local_388._cursor = local_388._cursor + 1;
        pFVar23 = pFVar23 + 1;
        puVar24 = local_360;
      }
      pFVar3 = pFVar3 + 1;
    } while (pFVar3 != local_368);
    pFVar3 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(puVar24 + 6);
    local_368 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                 (puVar24 + 8);
    if (pFVar3 != local_368) {
      do {
        pFVar1 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                  (local_360 + 0x20);
        pFVar21 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                   (local_360 + 0x1e);
        pFVar23 = pFVar21;
        puVar24 = local_360;
        for (; local_360 = puVar24, pFVar21 != pFVar1; pFVar21 = pFVar21 + 1) {
          pcVar20 = Kernel::NumTraits<Kernel::RationalConstantType>::geq;
          if ((pFVar3->literal)._symbol == GREATER) {
            pcVar20 = Kernel::NumTraits<Kernel::RationalConstantType>::greater;
          }
          local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
          ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)(pFVar3->literal)._term._ptr;
          local_310._24_8_ =
               ((long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                      local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_cursor -
                (long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                      local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_stack >> 4)
               * -0x5555555555555555;
          local_2c0.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                        (pFVar21->literal)._term._ptr;
          local_2a8._elem =
               (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               (((long)(local_2c0.a)->_cursor - (long)(local_2c0.a)->_stack >> 4) *
               -0x5555555555555555);
          uStack_2b8 = 0;
          local_2b0 = 0;
          local_318.x = (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                         *)local_358;
          local_310._8_8_ = 0;
          local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
          ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_338._1_7_ = (undefined7)((ulong)local_338 >> 8);
          local_338[0] = 1;
          local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
          ._M_end_of_storage = (_Bit_pointer)0x0;
          local_2a0._elem = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
          local_328.i = pFVar3;
          aStack_320.i = pFVar3;
          local_2d8.i = pFVar23;
          local_2d0.i = pFVar23;
          local_2c8.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                        local_318.x;
          TVar4 = Kernel::NumTraits<Kernel::RationalConstantType>::sum<_46f0486c_>
                            ((IterTraits<_cb7e2770_> *)local_338);
          pTVar5 = Kernel::NumTraits<Kernel::RationalConstantType>::zeroT();
          pLVar6 = (Literal *)(*pcVar20)(1,TVar4._content,pTVar5);
          if (local_388._cursor == local_388._end) {
            Lib::Stack<Kernel::Literal_*>::expand(&local_388);
          }
          *local_388._cursor = pLVar6;
          local_388._cursor = local_388._cursor + 1;
          pFVar23 = pFVar23 + 1;
          puVar24 = local_360;
        }
        pFVar3 = pFVar3 + 1;
      } while (pFVar3 != local_368);
    }
  }
  pFVar3 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(puVar24 + 0xe);
  local_368 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
               (puVar24 + 0x10);
  if (pFVar3 != local_368) {
    do {
      pFVar1 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                (puVar24 + 0x20);
      pFVar21 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                 (puVar24 + 0x1e);
      pFVar23 = pFVar21;
      puVar24 = local_360;
      for (; local_360 = puVar24, pFVar21 != pFVar1; pFVar21 = pFVar21 + 1) {
        pcVar20 = Kernel::NumTraits<Kernel::RationalConstantType>::geq;
        if ((pFVar3->literal)._symbol == GREATER) {
          pcVar20 = Kernel::NumTraits<Kernel::RationalConstantType>::greater;
        }
        local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)(pFVar3->literal)._term._ptr;
        local_310._24_8_ =
             ((long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                    local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_cursor -
              (long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                    local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_stack >> 4) *
             -0x5555555555555555;
        local_2c8.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                      (pFVar21->literal)._term._ptr;
        local_2b0 = ((long)(local_2c8.a)->_cursor - (long)(local_2c8.a)->_stack >> 4) *
                    -0x5555555555555555;
        local_2c0.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)0x0;
        uStack_2b8 = 0;
        local_318.x = (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                       *)local_358;
        local_310._8_8_ = 0;
        local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_338._1_7_ = (undefined7)((ulong)local_338 >> 8);
        local_338[0] = 1;
        local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        local_2a8._elem = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
        local_328.i = pFVar3;
        aStack_320.i = pFVar3;
        local_2e0.i = pFVar23;
        local_2d8.i = pFVar23;
        local_2d0.i = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                      local_318.x;
        TVar4 = Kernel::NumTraits<Kernel::RationalConstantType>::sum<_f61951ce_>
                          ((IterTraits<_fd1694d2_> *)local_338);
        pTVar5 = Kernel::NumTraits<Kernel::RationalConstantType>::zeroT();
        pLVar6 = (Literal *)(*pcVar20)(1,TVar4._content,pTVar5);
        if (local_388._cursor == local_388._end) {
          Lib::Stack<Kernel::Literal_*>::expand(&local_388);
        }
        *local_388._cursor = pLVar6;
        local_388._cursor = local_388._cursor + 1;
        pFVar23 = pFVar23 + 1;
        puVar24 = local_360;
      }
      pFVar3 = pFVar3 + 1;
    } while (pFVar3 != local_368);
  }
  local_368 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
              ((ulong)(*(long *)(puVar24 + 0x20) - *(long *)(puVar24 + 0x1e)) >> 6);
  if ((int)local_368 != 0) {
    local_360 = (uint *)0x1;
    uVar22 = 0;
    while( true ) {
      lVar9 = *(long *)(puVar24 + 0x20);
      lVar12 = *(long *)(puVar24 + 0x1e);
      uVar19 = uVar22;
      while (uVar19 = uVar19 + 1, (uint)uVar19 < (uint)((ulong)(lVar9 - lVar12) >> 6)) {
        lVar13 = *(long *)(puVar24 + 0x1e);
        local_328.i = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                      (lVar13 + uVar22 * 0x40);
        lVar11 = (uVar19 & 0xffffffff) * 0x40;
        local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p =
             (_Bit_type *)*(long *)(lVar13 + 0x30 + uVar22 * 0x40);
        local_2d8.i = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                      (lVar13 + lVar11);
        local_310._24_8_ =
             ((long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                    local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_cursor -
              (long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                    local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_stack >> 4) *
             -0x5555555555555555;
        local_2c0.a = *(Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> **)
                       (lVar13 + 0x30 + lVar11);
        local_2a8._elem =
             (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             (((long)(local_2c0.a)->_cursor - (long)(local_2c0.a)->_stack >> 4) *
             -0x5555555555555555);
        uStack_2b8 = 0;
        local_2b0 = 0;
        local_318.x = (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                       *)local_358;
        local_310._8_8_ = 0;
        local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_338[0] = 1;
        local_310.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        local_2a0._elem = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
        aStack_320.i = local_328.i;
        local_2d0.i = local_2d8.i;
        local_2c8.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                      local_318.x;
        TVar4 = Kernel::NumTraits<Kernel::RationalConstantType>::sum<_46f0486c_>
                          ((IterTraits<_cb7e2770_> *)local_338);
        arg2._content = (uint64_t)Kernel::NumTraits<Kernel::RationalConstantType>::zeroT();
        sort = Kernel::AtomicSort::rationalSort();
        pLVar6 = Kernel::Literal::createEquality(false,TVar4,arg2,sort);
        if (local_388._cursor == local_388._end) {
          Lib::Stack<Kernel::Literal_*>::expand(&local_388);
        }
        *local_388._cursor = pLVar6;
        local_388._cursor = local_388._cursor + 1;
      }
      if ((uint)local_368 <= (uint)local_360) break;
      uVar22 = (ulong)local_360 & 0xffffffff;
      local_360 = (uint *)((long)local_360 + 1);
    }
  }
  local_250 = *(long *)(puVar24 + 0x14);
  local_238 = *(undefined8 *)(puVar24 + 0x1a);
  puVar24[0x14] = 0;
  puVar24[0x15] = 0;
  puVar24[0x1a] = 0;
  puVar24[0x1b] = 0;
  local_268 = (undefined8 *)0x0;
  uStack_260 = 0;
  local_278 = 0;
  puStack_270 = (undefined8 *)0x0;
  local_248 = *(undefined8 **)(puVar24 + 0x16);
  puStack_240 = *(undefined8 **)(puVar24 + 0x18);
  puVar24[0x16] = 0;
  puVar24[0x17] = 0;
  puVar24[0x18] = 0;
  puVar24[0x19] = 0;
  local_230._isSome = false;
  local_230._1_7_ = 0;
  local_230._elem._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_230._elem._elem._8_8_ = 0;
  local_230._elem._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_230._elem._elem._24_8_ = 0;
  local_230._elem._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_200 = 0;
  Lib::
  iterTraits<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>>
            ((IterTraits<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
              *)local_338,(Lib *)&local_250,
             (PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)0x0);
  local_e8.common._capacity = local_388._capacity;
  local_388._capacity = 0;
  local_e8.common._end = local_388._end;
  local_388._end = (Literal **)0x0;
  local_e8.common._stack = local_388._stack;
  local_e8.common._cursor = local_388._cursor;
  local_388._stack = (Literal **)0x0;
  local_388._cursor = (Literal **)0x0;
  local_e8.I._capacity = *(size_t *)(puVar24 + 4);
  puVar24[4] = 0;
  puVar24[5] = 0;
  local_e8.I._end =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(puVar24 + 10);
  local_e8.I._stack =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(puVar24 + 6);
  local_e8.I._cursor =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(puVar24 + 8);
  puVar24[8] = 0;
  puVar24[9] = 0;
  puVar24[10] = 0;
  puVar24[0xb] = 0;
  puVar24[6] = 0;
  puVar24[7] = 0;
  local_e8.J._capacity = *(size_t *)(puVar24 + 0xc);
  puVar24[0xc] = 0;
  puVar24[0xd] = 0;
  local_e8.J._end =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(puVar24 + 0x12);
  local_e8.J._stack =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(puVar24 + 0xe);
  local_e8.J._cursor =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(puVar24 + 0x10);
  puVar24[0x10] = 0;
  puVar24[0x11] = 0;
  puVar24[0x12] = 0;
  puVar24[0x13] = 0;
  puVar24[0xe] = 0;
  puVar24[0xf] = 0;
  local_e8.L._capacity = *(size_t *)(puVar24 + 0x1c);
  puVar24[0x1c] = 0;
  puVar24[0x1d] = 0;
  local_e8.L._end =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(puVar24 + 0x22);
  local_e8.L._stack =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(puVar24 + 0x1e);
  local_e8.L._cursor =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(puVar24 + 0x20);
  puVar24[0x20] = 0;
  puVar24[0x21] = 0;
  puVar24[0x22] = 0;
  puVar24[0x23] = 0;
  puVar24[0x1e] = 0;
  puVar24[0x1f] = 0;
  local_e8.withoutX.x._id = local_344;
  local_e8.withoutX.x._ptr =
       (MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)local_290;
  local_e8.premise = (Clause *)local_340;
  local_e8.Ksize = local_288;
  local_e8.b.x._id = local_358._0_4_;
  local_e8.b.x._ptr =
       (MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)local_358._8_8_;
  Lib::
  IterTraits<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>>
  ::
  map<Inferences::ALASCA::VariableElimination::applyRule<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::Clause*,Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>>)const::_lambda(auto:1&)_3_>
            (&local_1f8,local_338,&local_e8);
  pVVar2 = local_280;
  Lib::
  pvi<Lib::IterTraits<Lib::MappingIterator<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>,Inferences::ALASCA::VariableElimination::applyRule<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::Clause*,Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>>)const::_lambda(auto:1&)_3_,Kernel::Clause*>>>
            ((Lib *)local_280,&local_1f8);
  Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::~OptionBase
            (&local_1f8._iter._inner._partition.
              super_OptionBase<std::vector<bool,_std::allocator<bool>_>_>);
  for (; local_1f8._iter._inner._orig._cursor != local_1f8._iter._inner._orig._stack;
      local_1f8._iter._inner._orig._cursor = local_1f8._iter._inner._orig._cursor + -1) {
    mpz_clear(local_1f8._iter._inner._orig._cursor[-1].numeral._den._val);
    mpz_clear((__mpz_struct *)&local_1f8._iter._inner._orig._cursor[-1].numeral);
  }
  if (local_1f8._iter._inner._orig._cursor !=
      (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
    if (local_1f8._iter._inner._orig._capacity << 6 == 0) {
      *(undefined8 *)local_1f8._iter._inner._orig._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_
      ;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_1f8._iter._inner._orig._stack;
    }
    else if (local_1f8._iter._inner._orig._capacity << 6 < 0x41) {
      *(undefined8 *)local_1f8._iter._inner._orig._stack =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_1f8._iter._inner._orig._stack;
    }
    else {
      operator_delete(local_1f8._iter._inner._orig._stack,0x10);
    }
  }
  const::{lambda(auto:1&)#3}::~FoundVariable((_lambda_auto_1___3_ *)&local_1f8);
  const::{lambda(auto:1&)#3}::~FoundVariable((_lambda_auto_1___3_ *)&local_e8);
  Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::~OptionBase
            ((OptionBase<std::vector<bool,_std::allocator<bool>_>_> *)&local_318);
  for (aVar16.i = local_328.i; aVar16.i != pFStack_330; aVar16.i = aVar16.i + -1) {
    mpz_clear(aVar16.i[-1].numeral._den._val);
    mpz_clear((__mpz_struct *)&aVar16.i[-1].numeral);
  }
  if (aVar16.i != (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
    if ((long)local_338 << 6 == 0) {
      *(undefined8 *)pFStack_330 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pFStack_330;
    }
    else if ((ulong)((long)local_338 << 6) < 0x41) {
      *(undefined8 *)pFStack_330 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pFStack_330;
    }
    else {
      operator_delete(pFStack_330,0x10);
    }
  }
  Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::~OptionBase(&local_230);
  for (puVar17 = puStack_240; puVar17 != local_248; puVar17 = puVar17 + -8) {
    mpz_clear((__mpz_struct *)(puVar17 + -5));
    mpz_clear((__mpz_struct *)(puVar17 + -7));
  }
  puVar18 = local_268;
  if (puVar17 != (undefined8 *)0x0) {
    if (local_250 << 6 == 0) {
      *local_248 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_248;
    }
    else if ((ulong)(local_250 << 6) < 0x41) {
      *local_248 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_248;
    }
    else {
      operator_delete(local_248,0x10);
      puVar18 = local_268;
    }
  }
  for (; puVar18 != puStack_270; puVar18 = puVar18 + -8) {
    mpz_clear((__mpz_struct *)(puVar18 + -5));
    mpz_clear((__mpz_struct *)(puVar18 + -7));
  }
  if (puVar18 != (undefined8 *)0x0) {
    if (local_278 << 6 == 0) {
      *puStack_270 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puStack_270;
    }
    else if ((ulong)(local_278 << 6) < 0x41) {
      *puStack_270 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puStack_270;
    }
    else {
      operator_delete(puStack_270,0x10);
    }
  }
  if (local_388._stack != (Literal **)0x0) {
    uVar22 = local_388._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar22 == 0) {
      *local_388._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_388._stack;
    }
    else if (uVar22 < 0x11) {
      *local_388._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_388._stack;
    }
    else if (uVar22 < 0x19) {
      *local_388._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_388._stack;
    }
    else if (uVar22 < 0x21) {
      *local_388._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_388._stack;
    }
    else if (uVar22 < 0x31) {
      *local_388._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_388._stack;
    }
    else if (uVar22 < 0x41) {
      *local_388._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_388._stack;
    }
    else {
      operator_delete(local_388._stack,0x10);
    }
  }
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)pVVar2;
}

Assistant:

ClauseIterator VariableElimination::applyRule(Clause* premise, FoundVariable<NumTraits> found) const
{
  TIME_TRACE("alasca vampire elimination")
  using Numeral = typename NumTraits::ConstantType;
  auto x = found.var;
  DEBUG("eliminating var: ", x)
  auto& I = found.posIneq;
  auto& J = found.negIneq;
  auto& L = found.neq;
  auto& K = found.eq;
  auto Ksize = K.size();

  if (Ksize > 0) {
    env.statistics->alascaVarElimKNonZeroCnt++;
  }
  env.statistics->alascaVarElimKSum += Ksize;
  if (Ksize > env.statistics->alascaVarElimKMax)
    env.statistics->alascaVarElimKMax = Ksize;

  auto Csize = premise->size() - Ksize - I.size() - J.size() - L.size();

  auto withoutX = [x](auto foundVarInLiteral) 
    { return foundVarInLiteral.literal.term().iterSummands()
                              .filter([&](auto monom) { return monom.factors != x; }); };


  Stack<Literal*> common(Csize + I.size() * J.size() + I.size() * L.size() + J.size() * L.size());

  { /* adding C */

    Stack<unsigned> nonCInd;
    auto addNonCInd = [&](auto& x) { for (auto idxd : x) { nonCInd.push(idxd.idx); } };
    addNonCInd(found.eq);
    addNonCInd(found.neq);
    addNonCInd(found.posIneq);
    addNonCInd(found.negIneq);
    std::sort(nonCInd.begin(), nonCInd.end());

    auto iter = nonCInd.iterFifo();
    auto skip = iter.hasNext() ? iter.next() : premise->size();
    for (unsigned i = 0; i < premise->size(); i++) {
      if (skip == i) {
        skip = iter.hasNext() ? iter.next() : premise->size();
      } else {
        ASS(skip > i)
        common.push((*premise)[i]);
      }
    }
  }

  auto b = [x](auto& i) {
    return iterTraits(i.literal.term().iterSummands())
      .filter([&](auto monom) { return monom.factors != x; })
      .map([&](auto t) { return (t / i.numeral.abs()); })
      .map([&](auto t) { return (i.literal.symbol() == AlascaPredicate::EQ || i.literal.symbol() == AlascaPredicate::NEQ) && i.numeral.isNegative()
                                ? -t : t; });
  };

  auto sum = [](auto l, auto r) {
    return NumTraits::sum(
      l.map([](auto monom){ return monom.denormalize(); }),
      r.map([](auto monom){ return monom.denormalize(); })); };

  auto minus = [](auto i) { return i.map([](auto monom) { return Numeral(-1) * monom; }); };

  { 
    // adding { bi + bj >ij 0 | i ∈ I, j ∈ J } 
    for (auto& i : I) {
      for (auto& j : J) {
        auto gr = i.literal.symbol() == AlascaPredicate::GREATER && j.literal.symbol() == AlascaPredicate::GREATER 
          ?  NumTraits::greater
          : NumTraits::geq;
        ASS(i.numeral.isPositive())
        ASS(j.numeral.isNegative())

        common.push(gr(true, sum(b(i), b(j)), NumTraits::zero()));
      }
    }
  }

  {
    // adding {  bi - bl  >i 0 |  i ∈ I,  l ∈ L }
    for (auto& i : I) {
      for (auto& l : L) {
        auto gr = i.literal.symbol() == AlascaPredicate::GREATER ? NumTraits::greater
                                                              : NumTraits::geq;
        common.push(gr(true, sum(b(i), minus(b(l))), NumTraits::zero()));
      }
    }
  }

  {
    // adding {  bj + bl  >j 0 |  j ∈ J,  l ∈ L }
    for (auto& j : J) {
      for (auto& l : L) {
        auto gr = j.literal.symbol() == AlascaPredicate::GREATER ? NumTraits::greater
                                                              : NumTraits::geq;
        common.push(gr(true, sum(b(j), b(l)), NumTraits::zero()));
      }
    }
  }

  { // adding { bl1 - bl2 /= 0 | ordered pairs (l1, l2) of L }
    // TODO write a test for me
    for (auto i1 : iterTraits(getRangeIterator(0u, (unsigned)L.size()))) {
      for (auto i2 : iterTraits(getRangeIterator(i1 + 1, (unsigned)L.size()))) {
        auto& l1 = L[i1];
        auto& l2 = L[i2];
        common.push(NumTraits::eq(false, sum(b(l1), minus(b(l2))), NumTraits::zero()));
      }
    }
  }


  return pvi(iterTraits(partitionIter(std::move(K)))
      .map([common = std::move(common), 
            I = std::move(I), 
            J = std::move(J), 
            L = std::move(L), 
            withoutX, 
            premise, 
            Ksize,
            sum, minus, b](auto& par) {

        auto Kp = [&]() { return par.partition(0);};
        auto Km = [&]() { return par.partition(1); };

        auto Kpsize = par.partitionSize(0);
        auto Kmsize = Ksize - Kpsize;

        Stack<Literal*> concl(common.size() + I.size() * Kpsize + + J.size() * Kmsize);
        concl.loadFromIterator(common.iterFifo());

        // adding {  bi - bk  >= 0 |   i ∈ I,   k ∈ Km }
        for (auto& k : Km()) {
          for (auto& i : I) {
            concl.push(NumTraits::geq(true, sum(b(i), minus(b(k))), NumTraits::zero()));
          }
        }

        // adding {  bj + bk  >= 0 |   j ∈ J,   k ∈ Kp }
        for (auto& k : Kp()) {
          for (auto& j : J) {
            concl.push(NumTraits::geq(true, sum(b(j), b(k)), NumTraits::zero()));
          }
        }

        // adding { bk1 - bk2 >= 0 |  k1 ∈ Kp, k2 ∈ Km }
        for (auto& k1 : Kp()) {
          for (auto& k2 : Km()) {
            // TODO test me
            concl.push(NumTraits::geq(true, sum(b(k1), minus(b(k2))), NumTraits::zero()));
          }
        }

        // adding {  bk - bl  >= 0 |  k ∈ Kp, l ∈ L }
        for (auto& k : Kp()) {
          for (auto& l : L) {
            // TODO test me
            concl.push(NumTraits::geq(true, sum(b(k), minus(b(l))), NumTraits::zero()));
          }
        }

        // adding {  bl - bk  >= 0 |  k ∈ Km, l ∈ L }
        for (auto& k : Km()) {
          for (auto& l : L) {
            // TODO test me
            concl.push(NumTraits::geq(true, sum(b(l), minus(b(k))), NumTraits::zero()));
          }
        }

        Inference inf(GeneratingInference1(Kernel::InferenceRule::ALASCA_VARIABLE_ELIMINATION, premise));
        auto out = Clause::fromStack(concl, inf);
        return out;
      }));
}